

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorManager.cpp
# Opt level: O0

unique_ptr<DetectorManager,_std::default_delete<DetectorManager>_> DetectorManager::create(void)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
  __l;
  void *pvVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  *in_RDI;
  DetectorManager *mgt;
  DetectorMap_t detectors;
  DetectorMap_t *in_stack_fffffffffffffee8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>
  *in_stack_fffffffffffffef0;
  shared_ptr<DetectorManager::DetectorLauncher<Yolact>_> *in_stack_ffffffffffffff10;
  char (*in_stack_ffffffffffffff18) [7];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>
  *in_stack_ffffffffffffff20;
  undefined8 **ppuVar2;
  allocator_type *in_stack_ffffffffffffff30;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__comp;
  _Head_base<0UL,_DetectorManager_*,_false> _Var3;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9f [2];
  undefined1 local_9d;
  undefined8 *local_80;
  undefined1 *local_78 [6];
  undefined8 *local_48;
  undefined8 local_40;
  
  local_9d = 1;
  local_80 = local_78;
  _Var3._M_head_impl = (DetectorManager *)in_RDI;
  std::make_shared<DetectorManager::DetectorLauncher<Yolact>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>
  ::pair<const_char_(&)[7],_std::shared_ptr<DetectorManager::DetectorLauncher<Yolact>_>,_true>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_9d = 0;
  local_48 = local_78;
  local_40 = 1;
  __comp = local_9f;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
               *)0x14281e);
  __l._M_len._0_4_ = in_stack_ffffffffffffff50;
  __l._M_array = (iterator)_Var3._M_head_impl;
  __l._M_len._4_4_ = in_stack_ffffffffffffff54;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  ::map(in_RDI,__l,__comp,in_stack_ffffffffffffff30);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
                *)0x142851);
  ppuVar2 = &local_48;
  do {
    ppuVar2 = ppuVar2 + -6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>
    ::~pair(in_stack_fffffffffffffef0);
  } while (ppuVar2 != (undefined8 **)local_78);
  std::shared_ptr<DetectorManager::DetectorLauncher<Yolact>_>::~shared_ptr
            ((shared_ptr<DetectorManager::DetectorLauncher<Yolact>_> *)0x14289b);
  pvVar1 = operator_new(0x30);
  DetectorManager((DetectorManager *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (pvVar1 == (void *)0x0) {
    std::unique_ptr<DetectorManager,std::default_delete<DetectorManager>>::
    unique_ptr<std::default_delete<DetectorManager>,void>
              ((unique_ptr<DetectorManager,_std::default_delete<DetectorManager>_> *)
               in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    std::unique_ptr<DetectorManager,std::default_delete<DetectorManager>>::
    unique_ptr<std::default_delete<DetectorManager>,void>
              ((unique_ptr<DetectorManager,_std::default_delete<DetectorManager>_> *)
               in_stack_fffffffffffffef0,(pointer)in_stack_fffffffffffffee8);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
          *)0x142a28);
  return (__uniq_ptr_data<DetectorManager,_std::default_delete<DetectorManager>,_true,_true>)
         (tuple<DetectorManager_*,_std::default_delete<DetectorManager>_>)_Var3._M_head_impl;
}

Assistant:

std::unique_ptr<DetectorManager> DetectorManager::create() 
{
	DetectorMap_t detectors = 
	{
		{"yolact", std::make_shared<DetectorLauncher<Yolact>>()},
	};

	auto mgt = new DetectorManager(detectors);
	if (!mgt) 
	{
		return nullptr;
	}

	return std::unique_ptr<DetectorManager>(std::move(mgt));
}